

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O3

string * __thiscall verilogAST::File::toString_abi_cxx11_(string *__return_storage_ptr__,File *this)

{
  pointer puVar1;
  pointer puVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_strs;
  string file_str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  long *local_a8 [2];
  long local_98 [2];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"");
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->modules).
           super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->modules).
           super__Vector_base<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar2 != puVar1) {
    do {
      (*(code *)**(undefined8 **)
                  (puVar2->_M_t).
                  super___uniq_ptr_impl<verilogAST::AbstractModule,_std::default_delete<verilogAST::AbstractModule>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_verilogAST::AbstractModule_*,_std::default_delete<verilogAST::AbstractModule>_>
                  .super__Head_base<0UL,_verilogAST::AbstractModule_*,_false>._M_head_impl)
                (&local_68);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      puVar2 = puVar2 + 1;
    } while (puVar2 != puVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,&local_c8);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"\n","");
  join(__return_storage_ptr__,&local_48,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string File::toString() {
  std::string file_str = "";

  std::vector<std::string> file_strs;
  for (auto &module : modules) {
    file_strs.push_back(module->toString());
  }

  return join(file_strs, "\n");
}